

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities
          (FluctuatingChargeConstraints *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer ppAVar6;
  pointer piVar7;
  Molecule *pMVar8;
  pointer ppAVar9;
  long lVar10;
  pointer ppAVar11;
  Atom *pAVar12;
  long lVar13;
  ulong uVar14;
  pointer ppAVar15;
  double dVar16;
  double dVar17;
  MoleculeIterator i;
  MoleculeIterator local_38;
  double local_30;
  double local_28;
  
  if (this->initialized_ == false) {
    if ((this->info_->usesFluctuatingCharges_ == true) &&
       (0 < this->info_->nGlobalFluctuatingCharges_)) {
      this->hasFlucQ_ = true;
    }
    this->initialized_ = true;
  }
  if (this->hasFlucQ_ == true) {
    local_38._M_node = (_Base_ptr)0x0;
    if (this->constrainRegions_ == true) {
      pdVar4 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar4 != pdVar5) {
        memset(pdVar4,0,((long)pdVar5 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
      }
      pdVar4 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar5 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pdVar4 != pdVar5) {
        memset(pdVar4,0,((long)pdVar5 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
      }
    }
    pMVar8 = SimInfo::beginMolecule(this->info_,&local_38);
    if (pMVar8 == (Molecule *)0x0) {
      local_30 = NAN;
    }
    else {
      local_30 = 0.0;
      local_28 = 0.0;
      do {
        if (pMVar8->constrainTotalCharge_ == false) {
          ppAVar9 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar6 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if ((ppAVar9 != ppAVar6) && (pAVar12 = *ppAVar9, pAVar12 != (Atom *)0x0)) {
            uVar2 = pMVar8->molStamp_->region_;
            bVar1 = this->constrainRegions_;
            piVar7 = (this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            pdVar5 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              ppAVar9 = ppAVar9 + 1;
              dVar16 = *(double *)
                        (*(long *)((long)&(((pAVar12->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).flucQVel.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                  (pAVar12->super_StuntDouble).storage_) +
                        (long)(pAVar12->super_StuntDouble).localIndex_ * 8) * pAVar12->chargeMass_;
              if ((-1 < (int)uVar2 & bVar1) == 0) {
                local_30 = local_30 + dVar16;
                local_28 = local_28 + pAVar12->chargeMass_;
              }
              else {
                iVar3 = piVar7[uVar2];
                pdVar4[iVar3] = dVar16 + pdVar4[iVar3];
                pdVar5[iVar3] = pAVar12->chargeMass_ + pdVar5[iVar3];
              }
            } while ((ppAVar9 != ppAVar6) && (pAVar12 = *ppAVar9, pAVar12 != (Atom *)0x0));
          }
        }
        pMVar8 = SimInfo::nextMolecule(this->info_,&local_38);
      } while (pMVar8 != (Molecule *)0x0);
      local_30 = local_30 / local_28;
    }
    if (this->constrainRegions_ == true) {
      pdVar4 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)(this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pdVar4;
      if (lVar10 != 0) {
        pdVar5 = (this->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar14 = 0;
        do {
          pdVar4[uVar14] = pdVar4[uVar14] / pdVar5[uVar14];
          uVar14 = uVar14 + 1;
        } while ((uVar14 & 0xffffffff) < (ulong)(lVar10 >> 3));
      }
    }
    pMVar8 = SimInfo::beginMolecule(this->info_,&local_38);
    while (pMVar8 != (Molecule *)0x0) {
      if (pMVar8->constrainTotalCharge_ == true) {
        ppAVar9 = (pMVar8->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar6 = (pMVar8->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((ppAVar9 != ppAVar6) && (pAVar12 = *ppAVar9, pAVar12 != (Atom *)0x0)) {
          ppAVar11 = ppAVar9 + 1;
          dVar16 = 0.0;
          dVar17 = 0.0;
          ppAVar15 = ppAVar11;
          do {
            dVar16 = *(double *)
                      (*(long *)((long)&(((pAVar12->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQVel.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar12->super_StuntDouble).storage_) +
                      (long)(pAVar12->super_StuntDouble).localIndex_ * 8) * pAVar12->chargeMass_ +
                     dVar16;
            dVar17 = dVar17 + pAVar12->chargeMass_;
            if (ppAVar15 == ppAVar6) break;
            pAVar12 = *ppAVar15;
            ppAVar15 = ppAVar15 + 1;
          } while (pAVar12 != (Atom *)0x0);
          if ((ppAVar9 != ppAVar6) && (pAVar12 = *ppAVar9, pAVar12 != (Atom *)0x0)) {
            do {
              lVar13 = (long)(pAVar12->super_StuntDouble).localIndex_;
              lVar10 = *(long *)((long)&(((pAVar12->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQVel.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar12->super_StuntDouble).storage_);
              *(double *)(lVar10 + lVar13 * 8) = *(double *)(lVar10 + lVar13 * 8) - dVar16 / dVar17;
              if (ppAVar11 == ppAVar6) break;
              pAVar12 = *ppAVar11;
              ppAVar11 = ppAVar11 + 1;
            } while (pAVar12 != (Atom *)0x0);
          }
        }
      }
      else {
        lVar10 = (long)pMVar8->molStamp_->region_;
        if ((lVar10 < 0) || (this->constrainRegions_ == false)) {
          ppAVar9 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar6 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppAVar9 != ppAVar6) {
            pAVar12 = *ppAVar9;
            while (pAVar12 != (Atom *)0x0) {
              ppAVar9 = ppAVar9 + 1;
              lVar13 = (long)(pAVar12->super_StuntDouble).localIndex_;
              lVar10 = *(long *)((long)&(((pAVar12->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQVel.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar12->super_StuntDouble).storage_);
              *(double *)(lVar10 + lVar13 * 8) = *(double *)(lVar10 + lVar13 * 8) - local_30;
              if (ppAVar9 == ppAVar6) break;
              pAVar12 = *ppAVar9;
            }
          }
        }
        else {
          ppAVar9 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar6 = (pMVar8->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if ((ppAVar9 != ppAVar6) && (pAVar12 = *ppAVar9, pAVar12 != (Atom *)0x0)) {
            dVar16 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start
                     [(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10]];
            do {
              ppAVar9 = ppAVar9 + 1;
              lVar13 = (long)(pAVar12->super_StuntDouble).localIndex_;
              lVar10 = *(long *)((long)&(((pAVar12->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQVel.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar12->super_StuntDouble).storage_);
              *(double *)(lVar10 + lVar13 * 8) = *(double *)(lVar10 + lVar13 * 8) - dVar16;
              if (ppAVar9 == ppAVar6) break;
              pAVar12 = *ppAVar9;
            } while (pAVar12 != (Atom *)0x0);
          }
        }
      }
      pMVar8 = SimInfo::nextMolecule(this->info_,&local_38);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities() {
    if (!initialized_) initialize();
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    RealType flucqP, systemCMom, regionCMom, molCMom, molFlucQMass, flucqW;
    RealType systemChargeMass;

    // accumulate the system fluctuating charge velocities, but we have
    // separate constraints for any charges in defined regions and for
    // molecules with constrained charges:

    systemCMom       = 0.0;
    systemChargeMass = 0.0;
    if (constrainRegions_) {
      std::fill(regionCMom_.begin(), regionCMom_.end(), 0.0);
      std::fill(regionChargeMass_.begin(), regionChargeMass_.end(), 0);
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (!mol->constrainTotalCharge()) {
        int region = mol->getRegion();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          flucqP = atom->getFlucQVel() * atom->getChargeMass();
          if (constrainRegions_ && region >= 0) {
            regionCMom_[regionKeys_[region]] += flucqP;
            regionChargeMass_[regionKeys_[region]] += atom->getChargeMass();
          } else {
            systemCMom += flucqP;
            systemChargeMass += atom->getChargeMass();
          }
        }
      }
    }

#ifdef IS_MPI
    // in parallel, we need to add up the contributions from all
    // processors:
    MPI_Allreduce(MPI_IN_PLACE, &systemCMom, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &systemChargeMass, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);

    if (constrainRegions_) {
      MPI_Allreduce(MPI_IN_PLACE, &regionCMom_[0], regionCMom_.size(),
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &regionChargeMass_[0],
                    regionChargeMass_.size(), MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
    }
#endif

    // divide by the total number of fluctuating charges:
    systemCMom /= systemChargeMass;

    // do the same in the regions:
    if (constrainRegions_) {
      for (unsigned int i = 0; i < regionCMom_.size(); ++i) {
        regionCMom_[i] /= regionChargeMass_[i];
      }
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      molCMom      = 0.0;
      molFlucQMass = 0.0;

      if (mol->constrainTotalCharge()) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          molCMom += atom->getFlucQVel() * atom->getChargeMass();
          molFlucQMass += atom->getChargeMass();
        }
        molCMom /= molFlucQMass;

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          flucqW = atom->getFlucQVel() - molCMom;
          atom->setFlucQVel(flucqW);
        }
      } else {
        int region = mol->getRegion();

        regionCMom = 0.0;
        if (constrainRegions_ && region >= 0) {
          regionCMom = regionCMom_[regionKeys_[region]];

          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            flucqW = atom->getFlucQVel() - regionCMom;
            atom->setFlucQVel(flucqW);
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            flucqW = atom->getFlucQVel() - systemCMom;
            atom->setFlucQVel(flucqW);
          }
        }
      }
    }
  }